

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O3

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* xemmai::t_module::f_execute_script
            (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             *__return_storage_ptr__,t_object *a_code)

{
  t_heap<xemmai::t_object> *this;
  t_type *ptVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_pvalue *ptVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  t_object *ptVar5;
  t_object *ptVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  t_fields fields;
  undefined1 in_stack_ffffffffffffffa8 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  ptVar1 = *(t_type **)(*(long *)(in_FS_OFFSET + -0x78) + 0xd8);
  this = (t_heap<xemmai::t_object> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x30);
  sVar10 = ptVar1->v_instance_fields * 0x10 + 0x58;
  if (sVar10 < 0x81) {
    ptVar5 = *(t_object **)(in_FS_OFFSET + -0x58);
    if (ptVar5 == (t_object *)0x0) {
      ptVar5 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x90),this);
      ptVar6 = ptVar5->v_next;
    }
    else {
      ptVar6 = ptVar5->v_next;
    }
    *(t_object **)(in_FS_OFFSET + -0x58) = ptVar6;
  }
  else {
    ptVar5 = t_heap<xemmai::t_object>::f_allocate_medium(this,sVar10);
  }
  ptVar5->v_next = (t_object *)0x0;
  auVar4 = _DAT_0017f0d0;
  auVar3 = _DAT_0017f0c0;
  sVar10 = ptVar1->v_instance_fields;
  if (sVar10 != 0) {
    lVar7 = sVar10 - 1;
    auVar11._8_4_ = (int)lVar7;
    auVar11._0_8_ = lVar7;
    auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
    pcVar8 = ptVar5->v_data;
    uVar9 = 0;
    auVar11 = auVar11 ^ _DAT_0017f0d0;
    do {
      pcVar8 = pcVar8 + 0x20;
      auVar12._8_4_ = (int)uVar9;
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = (int)(uVar9 >> 0x20);
      auVar12 = (auVar12 | auVar3) ^ auVar4;
      if ((bool)(~(auVar12._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar12._0_4_ ||
                  auVar11._4_4_ < auVar12._4_4_) & 1)) {
        pcVar8[-0x10] = '\0';
        pcVar8[-0xf] = '\0';
        pcVar8[-0xe] = '\0';
        pcVar8[-0xd] = '\0';
        pcVar8[-0xc] = '\0';
        pcVar8[-0xb] = '\0';
        pcVar8[-10] = '\0';
        pcVar8[-9] = '\0';
      }
      if ((auVar12._12_4_ != auVar11._12_4_ || auVar12._8_4_ <= auVar11._8_4_) &&
          auVar12._12_4_ <= auVar11._12_4_) {
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
      }
      uVar9 = uVar9 + 2;
    } while ((sVar10 + 1 & 0xfffffffffffffffe) != uVar9);
  }
  ptVar5->v_data[0] = '\0';
  ptVar5->v_data[1] = '\0';
  ptVar5->v_data[2] = '\0';
  ptVar5->v_data[3] = '\0';
  ptVar5->v_data[4] = '\0';
  ptVar5->v_data[5] = '\0';
  ptVar5->v_data[6] = '\0';
  ptVar5->v_data[7] = '\0';
  ptVar5->v_data[8] = '\0';
  ptVar5->v_data[9] = '\0';
  ptVar5->v_data[10] = '\0';
  ptVar5->v_data[0xb] = '\0';
  ptVar5->v_data[0xc] = '\0';
  ptVar5->v_data[0xd] = '\0';
  ptVar5->v_data[0xe] = '\0';
  ptVar5->v_data[0xf] = '\0';
  this_00 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *this_00->v_head = (t_object *)&ptVar1[-1].f_less;
  if (this_00->v_head == this_00->v_next) {
    t_slot::t_queue<128UL>::f_next(this_00);
  }
  else {
    this_00->v_head = this_00->v_head + 1;
  }
  ptVar5->v_type = ptVar1;
  this_01 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *this_01->v_head = ptVar5;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<256UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  ptVar5 = t_lambda::f_instantiate(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_);
  local_38 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  ptVar6 = f_new<xemmai::t_builder,xemmai::t_global>(*(t_global **)(in_FS_OFFSET + -0x78));
  *(undefined1 **)(ptVar6->v_data + 8) = &stack0xffffffffffffffa8;
  ptVar2 = *(t_pvalue **)(in_FS_OFFSET + -0x30);
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar2 + 2;
  ptVar2[1].super_t_pointer.v_p = ptVar6;
  (*ptVar5->v_type->f_call)(ptVar5,ptVar2,0);
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar2;
  ptVar6->v_data[8] = '\0';
  ptVar6->v_data[9] = '\0';
  ptVar6->v_data[10] = '\0';
  ptVar6->v_data[0xb] = '\0';
  ptVar6->v_data[0xc] = '\0';
  ptVar6->v_data[0xd] = '\0';
  ptVar6->v_data[0xe] = '\0';
  ptVar6->v_data[0xf] = '\0';
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::vector(__return_storage_ptr__,
           (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
            *)(local_48 + 8));
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             *)(local_48 + 8));
  std::vector<xemmai::t_root,_std::allocator<xemmai::t_root>_>::~vector
            ((vector<xemmai::t_root,_std::allocator<xemmai::t_root>_> *)&stack0xffffffffffffffa8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_module::f_execute_script(t_object* a_code)
{
	auto lambda = t_lambda::f_instantiate(xemmai::f_new<t_scope>(f_global()), a_code);
	t_fields fields;
	t_builder::f_do(fields, [&](auto builder)
	{
		t_scoped_stack stack(2);
		stack[1] = builder;
		lambda->f_call_without_loop(stack, 0);
	});
	return fields.v_class;
}